

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_floating_abi_cxx11_
          (result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  source_ptr *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator rollback;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  value_type *pvVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string str;
  floating v;
  result<toml::detail::region,_toml::detail::none_t> token;
  istringstream iss;
  allocator_type local_369;
  string local_368;
  undefined1 local_348 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_330;
  undefined1 local_328 [32];
  _Alloc_hider local_308;
  undefined1 local_300 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  string local_298;
  source_ptr *local_278;
  source_ptr *local_270;
  undefined1 local_268 [72];
  undefined1 local_220 [8];
  undefined1 local_218 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  undefined1 local_1a0 [8];
  undefined1 local_198 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  ios_base local_128 [264];
  
  rollback._M_current = *(char **)(this + 0x40);
  either<$e07b6a6f$>::invoke
            ((result<toml::detail::region,_toml::detail::none_t> *)&local_270,(location *)this);
  if (local_270._0_1_ != true) {
    location::reset((location *)this,rollback);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,"toml::parse_floating: ","");
    source_location::source_location((source_location *)&local_308,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[30],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1a0,(source_location *)&local_308,
               (char (*) [30])"the next token is not a float");
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_1a0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_348,__l_00,(allocator_type *)&local_298);
    local_328._0_8_ = (pointer)0x0;
    local_328._8_8_ = 0;
    local_328._16_8_ = 0;
    format_underline((string *)local_220,&local_368,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_348,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_328,false);
    local_268._8_8_ = local_218._8_8_;
    uVar3 = local_218._0_8_;
    local_270 = (source_ptr *)
                ((long)&(((anon_union_72_2_3176b685_for_result<toml::detail::region,_toml::detail::none_t>_3
                           *)local_268)->succ).value + 8);
    if (local_220 == (undefined1  [8])(local_218 + 8)) {
      local_268._16_8_ = local_218._16_8_;
      local_220 = (undefined1  [8])local_270;
    }
    local_218._0_8_ = (_func_int **)0x0;
    local_218._8_8_ = local_218._8_8_ & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    psVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
    *(source_ptr **)&__return_storage_ptr__->field_1 = psVar1;
    if (local_220 == (undefined1  [8])local_270) {
      (psVar1->
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_268._8_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._16_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first = (double)local_220;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_268._8_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)uVar3;
    local_268._0_8_ = (_func_int **)0x0;
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    local_220 = (undefined1  [8])(local_218 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_1a0);
    source_location::~source_location((source_location *)&local_308);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p == &local_368.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                     ((result<toml::detail::region,_toml::detail::none_t> *)&local_270);
  make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            (&local_368,(detail *)(pvVar7->first_)._M_current,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             (pvVar7->last_)._M_current,in_RCX);
  iVar6 = std::__cxx11::string::compare((char *)&local_368);
  if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&local_368), iVar6 == 0)) {
    pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)&local_270);
    local_308._M_p = (pointer)0x7ff0000000000000;
    region::region((region *)local_300,pvVar7);
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)&local_368);
    if (iVar6 == 0) {
      pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                         ((result<toml::detail::region,_toml::detail::none_t> *)&local_270);
      local_308._M_p = (pointer)0xfff0000000000000;
      region::region((region *)local_300,pvVar7);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_368);
      if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)&local_368), iVar6 == 0)) {
        pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                           ((result<toml::detail::region,_toml::detail::none_t> *)&local_270);
        local_308._M_p = (pointer)0x7ff8000000000000;
        region::region((region *)local_300,pvVar7);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_368);
        if (iVar6 != 0) {
          local_1a0[0] = 0x5f;
          _Var8 = std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_368._M_dataplus._M_p,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(local_368._M_dataplus._M_p + local_368._M_string_length),
                             (_Iter_equals_val<const_char>)local_1a0);
          std::__cxx11::string::erase
                    (&local_368,_Var8._M_current,
                     local_368._M_dataplus._M_p + local_368._M_string_length);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_1a0,(string *)&local_368,_S_in);
          local_278 = (source_ptr *)0x0;
          std::istream::_M_extract<double>((double *)local_1a0);
          if ((local_198[*(long *)((long)local_1a0 + 0xffffffffffffffe0U + 8) + 0x18] & 5) == 0) {
            pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                               ((result<toml::detail::region,_toml::detail::none_t> *)&local_270);
            local_220 = (undefined1  [8])local_278;
            region::region((region *)local_218,pvVar7);
            uVar5 = local_218._32_8_;
            uVar4 = local_218._16_8_;
            uVar3 = local_218._8_8_;
            local_300._24_8_ = &local_2d8;
            local_308._M_p = (pointer)local_220;
            local_300._0_8_ = &PTR__region_001d4f90;
            local_218._8_8_ = (element_type *)0x0;
            local_218._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._24_8_ == &local_1f0) {
              local_2d8._8_8_ = local_1f0._8_8_;
              local_218._24_8_ = local_300._24_8_;
            }
            local_2d8._M_allocated_capacity._1_7_ = local_1f0._M_allocated_capacity._1_7_;
            local_2d8._M_local_buf[0] = local_1f0._M_local_buf[0];
            local_218._32_8_ = 0;
            local_1f0._M_local_buf[0] = '\0';
            local_2c8._M_allocated_capacity = local_1e0._M_allocated_capacity;
            local_2c8._8_8_ = local_1e0._8_8_;
            __return_storage_ptr__->is_ok_ = true;
            (__return_storage_ptr__->field_1).succ.value.first = (double)local_220;
            (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base
                 = (_func_int **)&PTR__region_001d4f90;
            local_300._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (__return_storage_ptr__->field_1).succ.value.second.source_.
            super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar3;
            (__return_storage_ptr__->field_1).succ.value.second.source_.
            super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
            local_300._8_8_ = (element_type *)0x0;
            paVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)((long)&__return_storage_ptr__->field_1 + 0x20) = paVar2;
            if (local_218._24_8_ == local_300._24_8_) {
              paVar2->_M_allocated_capacity = local_2d8._M_allocated_capacity;
              *(undefined8 *)
               ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8)
                   = local_2d8._8_8_;
            }
            else {
              (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
                   (pointer)local_218._24_8_;
              (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2.
              _M_allocated_capacity = local_2d8._M_allocated_capacity;
            }
            (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length =
                 uVar5;
            local_300._32_8_ = 0;
            local_2d8._M_allocated_capacity =
                 (ulong)(uint7)local_1f0._M_allocated_capacity._1_7_ << 8;
            (__return_storage_ptr__->field_1).succ.value.second.first_._M_current =
                 (char *)local_1e0._M_allocated_capacity;
            (__return_storage_ptr__->field_1).succ.value.second.last_._M_current =
                 (char *)local_1e0._8_8_;
            local_218._24_8_ = &local_1f0;
            region::~region((region *)local_300);
            region::~region((region *)local_218);
          }
          else {
            location::reset((location *)this,rollback);
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_298,"toml::parse_floating:","");
            source_location::source_location((source_location *)local_220,(location *)this);
            std::
            pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<toml::source_location,_const_char_(&)[13],_true>
                      ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_308,(source_location *)local_220,(char (*) [13])"out of range");
            __l._M_len = 1;
            __l._M_array = (iterator)&local_308;
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector(&local_1d0,__l,&local_369);
            local_1b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline((string *)local_328,&local_298,&local_1d0,&local_1b8,false);
            local_348._16_8_ = local_328._16_8_;
            uVar3 = local_328._8_8_;
            local_348._0_8_ = local_348 + 0x10;
            if ((pointer)local_328._0_8_ == (pointer)((long)local_328 + 0x10U)) {
              p_Stack_330 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._24_8_;
              local_328._0_8_ = local_348._0_8_;
            }
            local_328._8_8_ = (_func_int **)0x0;
            local_328._16_8_ = local_328._16_8_ & 0xffffffffffffff00;
            __return_storage_ptr__->is_ok_ = false;
            psVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
            *(source_ptr **)&__return_storage_ptr__->field_1 = psVar1;
            if (local_328._0_8_ == local_348._0_8_) {
              (psVar1->
              super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = (element_type *)local_348._16_8_;
              (__return_storage_ptr__->field_1).succ.value.second.source_.
              super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Stack_330;
            }
            else {
              (__return_storage_ptr__->field_1).succ.value.first = (double)local_328._0_8_;
              (__return_storage_ptr__->field_1).succ.value.second.source_.
              super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)local_348._16_8_;
            }
            (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base
                 = (_func_int **)uVar3;
            local_348._8_8_ = (pointer)0x0;
            local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
            local_328._0_8_ = (pointer)((long)local_328 + 0x10U);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1b8);
            std::
            vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector(&local_1d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_allocated_capacity != &local_2a8) {
              operator_delete((void *)local_2b8._M_allocated_capacity,
                              local_2a8._M_allocated_capacity + 1);
            }
            source_location::~source_location((source_location *)&local_308);
            source_location::~source_location((source_location *)local_220);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
          std::ios_base::~ios_base(local_128);
          goto LAB_0013815b;
        }
        pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                           ((result<toml::detail::region,_toml::detail::none_t> *)&local_270);
        local_308._M_p = (pointer)0xfff8000000000000;
        region::region((region *)local_300,pvVar7);
      }
    }
  }
  local_170._M_allocated_capacity = local_2d8._M_allocated_capacity;
  uVar5 = local_300._32_8_;
  uVar4 = local_300._16_8_;
  uVar3 = local_300._8_8_;
  local_198._24_8_ = &local_170;
  local_1a0 = (undefined1  [8])local_308._M_p;
  local_198._0_8_ = &PTR__region_001d4f90;
  local_300._8_8_ = (element_type *)0x0;
  local_300._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._24_8_ == &local_2d8) {
    local_170._8_8_ = local_2d8._8_8_;
    local_300._24_8_ = local_198._24_8_;
  }
  local_300._32_8_ = 0;
  local_2d8._M_allocated_capacity = local_2d8._M_allocated_capacity & 0xffffffffffffff00;
  local_160._M_allocated_capacity = local_2c8._M_allocated_capacity;
  local_160._8_8_ = local_2c8._8_8_;
  __return_storage_ptr__->is_ok_ = true;
  (__return_storage_ptr__->field_1).succ.value.first = (double)local_308._M_p;
  (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
       (_func_int **)&PTR__region_001d4f90;
  local_198._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->field_1).succ.value.second.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar3;
  (__return_storage_ptr__->field_1).succ.value.second.source_.
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
  local_198._8_8_ = (pointer)0x0;
  paVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)((long)&__return_storage_ptr__->field_1 + 0x20) = paVar2;
  if (local_300._24_8_ == local_198._24_8_) {
    paVar2->_M_allocated_capacity = local_170._M_allocated_capacity;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
         local_170._8_8_;
  }
  else {
    (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
         (pointer)local_300._24_8_;
    (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2._M_allocated_capacity =
         local_170._M_allocated_capacity;
  }
  (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = uVar5;
  local_198._32_8_ = 0;
  local_170._M_allocated_capacity = local_170._M_allocated_capacity & 0xffffffffffffff00;
  (__return_storage_ptr__->field_1).succ.value.second.first_._M_current =
       (char *)local_2c8._M_allocated_capacity;
  (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = (char *)local_2c8._8_8_;
  local_300._24_8_ = &local_2d8;
  region::~region((region *)local_198);
  region::~region((region *)local_300);
LAB_0013815b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (local_270._0_1_ == true) {
    region::~region(&(((anon_union_72_2_3176b685_for_result<toml::detail::region,_toml::detail::none_t>_3
                        *)local_268)->succ).value);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<floating, region>, std::string>
parse_floating(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_float::invoke(loc))
    {
        auto str = token.unwrap().str();
        if(str == "inf" || str == "+inf")
        {
            if(std::numeric_limits<floating>::has_infinity)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::infinity(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: inf value found"
                    " but the current environment does not support inf. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "-inf")
        {
            if(std::numeric_limits<floating>::has_infinity)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::infinity(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: inf value found"
                    " but the current environment does not support inf. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "nan" || str == "+nan")
        {
            if(std::numeric_limits<floating>::has_quiet_NaN)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::quiet_NaN(), token.unwrap()));
            }
            else if(std::numeric_limits<floating>::has_signaling_NaN)
            {
                return ok(std::make_pair(
                    std::numeric_limits<floating>::signaling_NaN(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: NaN value found"
                    " but the current environment does not support NaN. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        else if(str == "-nan")
        {
            if(std::numeric_limits<floating>::has_quiet_NaN)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::quiet_NaN(), token.unwrap()));
            }
            else if(std::numeric_limits<floating>::has_signaling_NaN)
            {
                return ok(std::make_pair(
                    -std::numeric_limits<floating>::signaling_NaN(), token.unwrap()));
            }
            else
            {
                throw std::domain_error("toml::parse_floating: NaN value found"
                    " but the current environment does not support NaN. Please"
                    " make sure that the floating-point implementation conforms"
                    " IEEE 754/ISO 60559 international standard.");
            }
        }
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());
        std::istringstream iss(str);
        floating v(0.0);
        iss >> v;
        if(iss.fail())
        {
            // see parse_octal_integer for detail of this error message.
            loc.reset(first);
            return err(format_underline("toml::parse_floating:",
                       {{source_location(loc), "out of range"}}));
        }
        return ok(std::make_pair(v, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("toml::parse_floating: ",
               {{source_location(loc), "the next token is not a float"}}));
}